

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.cpp
# Opt level: O2

void __thiscall
mocker::ir::BuilderContext::addGlobalVar(BuilderContext *this,string *ident,string *data)

{
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)ident);
  std::__cxx11::string::string((string *)&local_60,(string *)data);
  Module::addGlobalVar(&this->module,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void BuilderContext::addGlobalVar(std::string ident, std::string data) {
  module.addGlobalVar(std::move(ident), std::move(data));
}